

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O2

double minimax::ABeta_<ttt::Board,minimax::Eval<ttt::Board>>
                 (Board *game,int depth,double alfa,double beta)

{
  double dVar1;
  IPlayer IVar2;
  int iVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  uint extraout_XMM0_Dd;
  double dVar7;
  undefined8 in_XMM1_Qb;
  Eval<ttt::Board> evaluator;
  Board new_game;
  long m;
  vector<long,_std::allocator<long>_> moves;
  Eval<ttt::Board> local_a1;
  double local_a0;
  Board local_98;
  undefined1 local_88 [16];
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = alfa;
  local_88._12_4_ = in_XMM0_Dd;
  local_68 = beta;
  if (depth == 0) {
    dVar7 = Eval<ttt::Board>::operator()(&local_a1,game);
    uVar5 = SUB84(dVar7,0);
    uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
  }
  else {
    uStack_60 = in_XMM1_Qb;
    iVar3 = ttt::Board::GetStatus(game);
    if (iVar3 == -1) {
      ttt::Board::GetPossibleMoves((vector<long,_std::allocator<long>_> *)&local_48,game);
      uStack_54 = local_68._4_4_ ^ 0x80000000;
      uStack_4c = (uint)((ulong)uStack_60 >> 0x20) ^ 0x80000000;
      uStack_50 = (undefined4)uStack_60;
      local_58 = (undefined4)local_68;
      dVar7 = 0.0;
      bVar4 = false;
      do {
        if (local_48._M_impl.super__Vector_impl_data._M_start ==
            local_48._M_impl.super__Vector_impl_data._M_finish) break;
        local_70 = *local_48._M_impl.super__Vector_impl_data._M_start;
        local_98._8_2_ = *(undefined2 *)((game->board)._M_elems[2]._M_elems + 2);
        local_98.board._M_elems._0_8_ = *(undefined8 *)(game->board)._M_elems;
        local_a0 = dVar7;
        ttt::Board::ApplyMove(&local_98,&local_70);
        dVar7 = ABeta_<ttt::Board,minimax::Eval<ttt::Board>>
                          (&local_98,depth + -1,(double)CONCAT44(uStack_54,local_58),
                           -(double)local_88._0_8_);
        dVar1 = -dVar7;
        uVar5 = SUB84(dVar7,0);
        uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar7 = dVar1;
        if ((bVar4) && (dVar1 <= local_a0)) {
          dVar7 = local_a0;
        }
        if (dVar1 <= (double)local_88._0_8_) {
          uVar5 = local_88._0_4_;
          uVar6 = local_88._4_4_;
        }
        local_48._M_impl.super__Vector_impl_data._M_start =
             local_48._M_impl.super__Vector_impl_data._M_start + 1;
        bVar4 = true;
        local_88._4_4_ = uVar6;
        local_88._0_4_ = uVar5;
        local_88._8_4_ = extraout_XMM0_Dc;
        local_88._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
      } while ((double)CONCAT44(uVar6,uVar5) < local_68);
      local_a0 = dVar7;
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
      uVar5 = SUB84(local_a0,0);
      uVar6 = (undefined4)((ulong)local_a0 >> 0x20);
    }
    else {
      uVar5 = 0;
      uVar6 = 0;
      if (iVar3 != 0) {
        IVar2 = ttt::Board::GetPlayerToMove(game);
        if (iVar3 == IVar2) {
          uVar5 = 0xffffffff;
          uVar6 = 0x7fefffff;
        }
        else {
          uVar5 = 0xffffffff;
          uVar6 = 0xffefffff;
        }
      }
    }
  }
  return (double)CONCAT44(uVar6,uVar5);
}

Assistant:

static double
ABeta_(const IGame &game, int depth, double alfa, double beta)
{
    Eval evaluator;

    if (depth == 0)
        return evaluator(game);

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        if (status == game::Draw)
            return 0.0;
        if (status == game.GetPlayerToMove())
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }

    bool result_set = false;
    double result = 0.0;
    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        IGame new_game(game);
        new_game.ApplyMove(m);
        auto r = -ABeta_<IGame, Eval>(new_game, depth - 1, -beta, -alfa);
        if (!result_set || r > result)
            result = r, result_set = true;
        alfa = std::max(alfa, r);
        if (alfa >= beta)
            break;
    }

    return result;
}